

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

size_t __thiscall ddd::DaTrie<true,_true,_true>::size_in_bytes(DaTrie<true,_true,_true> *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t size;
  
  sVar1 = utils::size_in_bytes<ddd::Bc>((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x180050);
  sVar2 = utils::size_in_bytes<char>((vector<char,_std::allocator<char>_> *)0x180067);
  sVar3 = utils::size_in_bytes<ddd::BlockLink>
                    ((vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)0x18007e);
  sVar4 = utils::size_in_bytes<ddd::NodeLink>
                    ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x180095);
  return sVar4 + sVar3 + sVar2 + sVar1 + 0xc;
}

Assistant:

size_t size_in_bytes() const {
    size_t size = 0;
    size += utils::size_in_bytes(bc_);
    size += utils::size_in_bytes(tail_);
    size += utils::size_in_bytes(blocks_);
    size += utils::size_in_bytes(node_links_);
    size += sizeof(head_pos_);
    size += sizeof(bc_emps_);
    size += sizeof(tail_emps_);
    return size;
  }